

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandCexLoad(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Cex_t *pAVar2;
  char *format;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    pAVar2 = pAbc->pCex2;
    if (pAVar2 != (Abc_Cex_t *)0x0) {
      if (pAbc->pCex != (Abc_Cex_t *)0x0) {
        free(pAbc->pCex);
        pAbc->pCex = (Abc_Cex_t *)0x0;
        pAVar2 = pAbc->pCex2;
      }
      pAVar2 = Abc_CexDup(pAVar2,-1);
      pAbc->pCex = pAVar2;
      pAbc->nFrames = pAbc->pCex2->iFrame;
      pAbc->Status = 0;
      return 0;
    }
    format = "Saved CEX is not available.\n";
    iVar1 = -1;
  }
  else {
    iVar1 = -2;
    Abc_Print(-2,"usage: cexload [-h]\n");
    Abc_Print(-2,"\t        loads the current CEX from the internal storage\n");
    format = "\t-h    : print the command usage\n";
  }
  Abc_Print(iVar1,format);
  return 1;
}

Assistant:

int Abc_CommandCexLoad( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pCex2 == NULL )
    {
        Abc_Print( -1, "Saved CEX is not available.\n" );
        return 1;
    }
    ABC_FREE( pAbc->pCex );
    pAbc->pCex = Abc_CexDup( pAbc->pCex2, -1 );
    // update status
    pAbc->nFrames = pAbc->pCex2->iFrame;
    pAbc->Status = 0;
    return 0;

usage:
    Abc_Print( -2, "usage: cexload [-h]\n" );
    Abc_Print( -2, "\t        loads the current CEX from the internal storage\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}